

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Int64ConstOpnd::IsEqualInternal(Int64ConstOpnd *this,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  undefined4 *puVar6;
  Int64ConstOpnd *pIVar7;
  Opnd *opnd_local;
  Int64ConstOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindInt64Const) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x659,"(m_kind == OpndKindInt64Const)","m_kind == OpndKindInt64Const");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = Opnd::IsInt64ConstOpnd(opnd);
  if (bVar3) {
    IVar4 = Opnd::GetType(&this->super_Opnd);
    IVar5 = Opnd::GetType(opnd);
    if (IVar4 == IVar5) {
      lVar1 = (this->super_EncodableOpnd<long>).m_value;
      pIVar7 = Opnd::AsInt64ConstOpnd(opnd);
      return lVar1 == (pIVar7->super_EncodableOpnd<long>).m_value;
    }
  }
  return false;
}

Assistant:

bool Int64ConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindInt64Const);
    if (!opnd->IsInt64ConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsInt64ConstOpnd()->m_value;
}